

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_insert_pointer_Test::IntrusiveListTest_insert_pointer_Test
          (IntrusiveListTest_insert_pointer_Test *this)

{
  anon_unknown.dwarf_6462d::IntrusiveListTest::IntrusiveListTest(&this->super_IntrusiveListTest);
  (this->super_IntrusiveListTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_002e95b0;
  return;
}

Assistant:

TEST_F(IntrusiveListTest, insert_pointer) {
  TestObjectList list;

  list.insert(list.begin(), MakeUnique<TestObject>(2));
  list.insert(list.end(), MakeUnique<TestObject>(4));
  list.insert(std::next(list.begin()), MakeUnique<TestObject>(3));
  list.insert(list.begin(), MakeUnique<TestObject>(1));

  AssertListEq(list, {1, 2, 3, 4});
}